

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O1

CharMapper<unsigned_char> * gmlc::utilities::base64Mapper(void)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uchar uVar9;
  long lVar10;
  CharMapper<unsigned_char> *in_RDI;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  
  memset(in_RDI,0xff,0x100);
  auVar8 = _DAT_003fb920;
  auVar7 = _DAT_003fb910;
  auVar6 = _DAT_003fb900;
  auVar5 = _DAT_003fb8f0;
  auVar4 = _DAT_003fb8e0;
  auVar3 = _DAT_003fb8d0;
  auVar2 = _DAT_003fb8c0;
  auVar12 = _DAT_003fb8b0;
  auVar11 = _DAT_003fb8a0;
  lVar10 = 0;
  do {
    auVar14._8_4_ = (int)lVar10;
    auVar14._0_8_ = lVar10;
    auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar18 = (auVar14 | auVar7) ^ auVar8;
    iVar13 = auVar18._0_4_;
    iVar17 = auVar18._8_4_;
    auVar35._4_4_ = iVar13;
    auVar35._0_4_ = iVar13;
    auVar35._8_4_ = iVar17;
    auVar35._12_4_ = iVar17;
    auVar51._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar51._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar51._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar51._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar19._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar51;
    auVar18 = pshuflw(auVar35,auVar19,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    uVar9 = (uchar)lVar10;
    if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x41] = uVar9;
    }
    auVar18 = packssdw(auVar19,auVar19);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._0_4_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x42] = uVar9 + '\x01';
    }
    auVar18 = (auVar14 | auVar6) ^ auVar8;
    iVar13 = auVar18._0_4_;
    iVar17 = auVar18._8_4_;
    auVar36._4_4_ = iVar13;
    auVar36._0_4_ = iVar13;
    auVar36._8_4_ = iVar17;
    auVar36._12_4_ = iVar17;
    auVar52._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar52._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar52._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar52._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar20._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar52;
    auVar18 = packssdw(auVar36,auVar20);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x43] = uVar9 + '\x02';
    }
    auVar18 = pshufhw(auVar20,auVar20,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._0_4_ >> 0x18 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x44] = uVar9 + '\x03';
    }
    auVar18 = (auVar14 | auVar5) ^ auVar8;
    iVar13 = auVar18._0_4_;
    iVar17 = auVar18._8_4_;
    auVar37._4_4_ = iVar13;
    auVar37._0_4_ = iVar13;
    auVar37._8_4_ = iVar17;
    auVar37._12_4_ = iVar17;
    auVar53._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar53._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar53._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar53._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar21._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar53;
    auVar18 = pshuflw(auVar37,auVar21,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x45] = uVar9 + '\x04';
    }
    auVar18 = packssdw(auVar21,auVar21);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._4_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x46] = uVar9 + '\x05';
    }
    auVar18 = (auVar14 | auVar4) ^ auVar8;
    iVar13 = auVar18._0_4_;
    iVar17 = auVar18._8_4_;
    auVar38._4_4_ = iVar13;
    auVar38._0_4_ = iVar13;
    auVar38._8_4_ = iVar17;
    auVar38._12_4_ = iVar17;
    auVar54._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar54._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar54._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar54._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar22._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar54;
    auVar18 = packssdw(auVar38,auVar22);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x47] = uVar9 + '\x06';
    }
    auVar18 = pshufhw(auVar22,auVar22,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._6_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x48] = uVar9 + '\a';
    }
    auVar18 = (auVar14 | auVar3) ^ auVar8;
    iVar13 = auVar18._0_4_;
    iVar17 = auVar18._8_4_;
    auVar39._4_4_ = iVar13;
    auVar39._0_4_ = iVar13;
    auVar39._8_4_ = iVar17;
    auVar39._12_4_ = iVar17;
    auVar55._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar55._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar55._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar55._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar23._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar23._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar23._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar23._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar23 = auVar23 & auVar55;
    auVar18 = pshuflw(auVar39,auVar23,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x49] = uVar9 + '\b';
    }
    auVar18 = packssdw(auVar23,auVar23);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._8_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x4a] = uVar9 + '\t';
    }
    auVar18 = (auVar14 | auVar2) ^ auVar8;
    iVar13 = auVar18._0_4_;
    iVar17 = auVar18._8_4_;
    auVar40._4_4_ = iVar13;
    auVar40._0_4_ = iVar13;
    auVar40._8_4_ = iVar17;
    auVar40._12_4_ = iVar17;
    auVar56._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar56._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar56._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar56._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar24._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar24._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar24._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar24._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar24 = auVar24 & auVar56;
    auVar18 = packssdw(auVar40,auVar24);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x4b] = uVar9 + '\n';
    }
    auVar18 = pshufhw(auVar24,auVar24,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._10_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x4c] = uVar9 + '\v';
    }
    auVar18 = (auVar14 | auVar12) ^ auVar8;
    iVar13 = auVar18._0_4_;
    iVar17 = auVar18._8_4_;
    auVar41._4_4_ = iVar13;
    auVar41._0_4_ = iVar13;
    auVar41._8_4_ = iVar17;
    auVar41._12_4_ = iVar17;
    auVar57._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar57._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar57._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar57._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar25._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar25._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar25._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar25._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar25 = auVar25 & auVar57;
    auVar18 = pshuflw(auVar41,auVar25,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x4d] = uVar9 + '\f';
    }
    auVar18 = packssdw(auVar25,auVar25);
    auVar18 = packssdw(auVar18,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    if ((auVar18._12_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x4e] = uVar9 + '\r';
    }
    auVar14 = (auVar14 | auVar11) ^ auVar8;
    iVar13 = auVar14._0_4_;
    iVar17 = auVar14._8_4_;
    auVar26._4_4_ = iVar13;
    auVar26._0_4_ = iVar13;
    auVar26._8_4_ = iVar17;
    auVar26._12_4_ = iVar17;
    auVar42._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar42._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar42._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar42._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar18._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar18._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar18._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar18._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar18 = auVar18 & auVar42;
    auVar14 = packssdw(auVar26,auVar18);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x4f] = uVar9 + '\x0e';
    }
    auVar14 = pshufhw(auVar18,auVar18,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._14_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x50] = uVar9 + '\x0f';
    }
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x20);
  lVar10 = 0;
  do {
    auVar15._8_4_ = (int)lVar10;
    auVar15._0_8_ = lVar10;
    auVar15._12_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar14 = (auVar15 | auVar7) ^ auVar8;
    iVar13 = auVar14._0_4_;
    iVar17 = auVar14._8_4_;
    auVar43._4_4_ = iVar13;
    auVar43._0_4_ = iVar13;
    auVar43._8_4_ = iVar17;
    auVar43._12_4_ = iVar17;
    auVar58._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar58._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar58._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar58._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar27._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar27._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar27._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar27._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar27 = auVar27 & auVar58;
    auVar14 = pshuflw(auVar43,auVar27,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    cVar1 = (char)lVar10;
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x61] = cVar1 + '\x1a';
    }
    auVar14 = packssdw(auVar27,auVar27);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x62] = cVar1 + '\x1b';
    }
    auVar14 = (auVar15 | auVar6) ^ auVar8;
    iVar13 = auVar14._0_4_;
    iVar17 = auVar14._8_4_;
    auVar44._4_4_ = iVar13;
    auVar44._0_4_ = iVar13;
    auVar44._8_4_ = iVar17;
    auVar44._12_4_ = iVar17;
    auVar59._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar59._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar59._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar59._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar28._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar28._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar28._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar28._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar28 = auVar28 & auVar59;
    auVar14 = packssdw(auVar44,auVar28);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 0x10 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 99] = cVar1 + '\x1c';
    }
    auVar14 = pshufhw(auVar28,auVar28,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 0x18 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 100] = cVar1 + '\x1d';
    }
    auVar14 = (auVar15 | auVar5) ^ auVar8;
    iVar13 = auVar14._0_4_;
    iVar17 = auVar14._8_4_;
    auVar45._4_4_ = iVar13;
    auVar45._0_4_ = iVar13;
    auVar45._8_4_ = iVar17;
    auVar45._12_4_ = iVar17;
    auVar60._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar60._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar60._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar60._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar29._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar29._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar29._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar29._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar29 = auVar29 & auVar60;
    auVar14 = pshuflw(auVar45,auVar29,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x65] = cVar1 + '\x1e';
    }
    auVar14 = packssdw(auVar29,auVar29);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._4_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x66] = cVar1 + '\x1f';
    }
    auVar14 = (auVar15 | auVar4) ^ auVar8;
    iVar13 = auVar14._0_4_;
    iVar17 = auVar14._8_4_;
    auVar46._4_4_ = iVar13;
    auVar46._0_4_ = iVar13;
    auVar46._8_4_ = iVar17;
    auVar46._12_4_ = iVar17;
    auVar61._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar61._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar61._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar61._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar30._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar30._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar30._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar30._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar30 = auVar30 & auVar61;
    auVar14 = packssdw(auVar46,auVar30);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x67] = cVar1 + ' ';
    }
    auVar14 = pshufhw(auVar30,auVar30,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._6_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x68] = cVar1 + '!';
    }
    auVar14 = (auVar15 | auVar3) ^ auVar8;
    iVar13 = auVar14._0_4_;
    iVar17 = auVar14._8_4_;
    auVar47._4_4_ = iVar13;
    auVar47._0_4_ = iVar13;
    auVar47._8_4_ = iVar17;
    auVar47._12_4_ = iVar17;
    auVar62._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar62._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar62._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar62._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar31._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar31._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar31._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar31._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar31 = auVar31 & auVar62;
    auVar14 = pshuflw(auVar47,auVar31,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x69] = cVar1 + '\"';
    }
    auVar14 = packssdw(auVar31,auVar31);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._8_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x6a] = cVar1 + '#';
    }
    auVar14 = (auVar15 | auVar2) ^ auVar8;
    iVar13 = auVar14._0_4_;
    iVar17 = auVar14._8_4_;
    auVar48._4_4_ = iVar13;
    auVar48._0_4_ = iVar13;
    auVar48._8_4_ = iVar17;
    auVar48._12_4_ = iVar17;
    auVar63._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar63._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar63._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar63._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar32._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar32._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar32._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar32._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar32 = auVar32 & auVar63;
    auVar14 = packssdw(auVar48,auVar32);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x6b] = cVar1 + '$';
    }
    auVar14 = pshufhw(auVar32,auVar32,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._10_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x6c] = cVar1 + '%';
    }
    auVar14 = (auVar15 | auVar12) ^ auVar8;
    iVar13 = auVar14._0_4_;
    iVar17 = auVar14._8_4_;
    auVar49._4_4_ = iVar13;
    auVar49._0_4_ = iVar13;
    auVar49._8_4_ = iVar17;
    auVar49._12_4_ = iVar17;
    auVar64._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar64._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar64._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar64._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar33._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar33._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar33._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar33._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar33 = auVar33 & auVar64;
    auVar14 = pshuflw(auVar49,auVar33,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x6d] = cVar1 + '&';
    }
    auVar14 = packssdw(auVar33,auVar33);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._12_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x6e] = cVar1 + '\'';
    }
    auVar14 = (auVar15 | auVar11) ^ auVar8;
    iVar13 = auVar14._0_4_;
    iVar17 = auVar14._8_4_;
    auVar34._4_4_ = iVar13;
    auVar34._0_4_ = iVar13;
    auVar34._8_4_ = iVar17;
    auVar34._12_4_ = iVar17;
    auVar50._0_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar50._4_4_ = -(uint)(iVar13 < -0x7fffffe6);
    auVar50._8_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar50._12_4_ = -(uint)(iVar17 < -0x7fffffe6);
    auVar16._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar16._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar16._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar16._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar16 = auVar16 & auVar50;
    auVar14 = packssdw(auVar34,auVar16);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      (in_RDI->key)._M_elems[lVar10 + 0x6f] = cVar1 + '(';
    }
    auVar14 = pshufhw(auVar16,auVar16,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._14_2_ >> 8 & 1) != 0) {
      (in_RDI->key)._M_elems[lVar10 + 0x70] = cVar1 + ')';
    }
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x20);
  lVar10 = 0;
  do {
    auVar11._8_4_ = (int)lVar10;
    auVar11._0_8_ = lVar10;
    auVar11._12_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar12 = (auVar11 | auVar7) ^ auVar8;
    cVar1 = (char)lVar10;
    if (auVar12._4_4_ == -0x80000000 && auVar12._0_4_ < -0x7ffffff6) {
      (in_RDI->key)._M_elems[lVar10 + 0x30] = cVar1 + '4';
      (in_RDI->key)._M_elems[lVar10 + 0x31] = cVar1 + '5';
    }
    auVar11 = (auVar11 | auVar6) ^ auVar8;
    if (auVar11._4_4_ == -0x80000000 && auVar11._0_4_ < -0x7ffffff6) {
      (in_RDI->key)._M_elems[lVar10 + 0x32] = cVar1 + '6';
      (in_RDI->key)._M_elems[lVar10 + 0x33] = cVar1 + '7';
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  (in_RDI->key)._M_elems[0x2b] = '>';
  (in_RDI->key)._M_elems[0x2f] = '?';
  return in_RDI;
}

Assistant:

CharMapper<unsigned char> base64Mapper()
{
    CharMapper<unsigned char> b64(0xFF);
    unsigned char val{0};
    for (unsigned char indexChar = 'A'; indexChar <= 'Z'; ++indexChar) {
        b64.addKey(indexChar, val);
        ++val;
    }
    for (unsigned char indexChar = 'a'; indexChar <= 'z'; ++indexChar) {
        b64.addKey(indexChar, val);
        ++val;
    }
    for (unsigned char indexChar = '0'; indexChar <= '9'; ++indexChar) {
        b64.addKey(indexChar, val);
        ++val;
    }
    b64.addKey('+', val++);
    b64.addKey('/', val);
    return b64;
}